

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptDate * __thiscall Js::JavascriptLibrary::CreateDate(JavascriptLibrary *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  JavascriptDate *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->dateType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x17fa,"(dateType)","Where\'s dateType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40 = (undefined1  [8])&JavascriptDate::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x17fb;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_40);
  this_00 = (JavascriptDate *)new<Memory::Recycler>(0x80,alloc,0x387914);
  JavascriptDate::JavascriptDate(this_00,0.0,(this->dateType).ptr);
  return this_00;
}

Assistant:

JavascriptDate* JavascriptLibrary::CreateDate()
    {
        AssertMsg(dateType, "Where's dateType?");
        return RecyclerNew(this->GetRecycler(), JavascriptDate, 0, dateType);
    }